

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsluv.c
# Opt level: O1

void hsluv2rgb(double h,double s,double l,double *pr,double *pg,double *pb)

{
  double dVar1;
  double dVar2;
  double __x;
  Triplet local_38;
  
  dVar1 = 0.0;
  if (l <= 99.9999999) {
    dVar1 = 0.0;
    if (1e-08 <= l) {
      local_38.a = h;
      local_38.b = s;
      local_38.c = l;
      dVar1 = max_chroma_for_lh(l,h);
      dVar1 = (dVar1 / 100.0) * s;
    }
  }
  local_38.c = (double)(~-(ulong)(s < 1e-08) & (ulong)h);
  __x = local_38.c * 0.017453292519943295;
  local_38.a = l;
  local_38.b = dVar1;
  dVar2 = cos(__x);
  local_38.c = sin(__x);
  local_38.b = dVar2 * dVar1;
  local_38.c = local_38.c * dVar1;
  luv2xyz(&local_38);
  xyz2rgb(&local_38);
  dVar1 = 1.0;
  if (local_38.a <= 1.0) {
    dVar1 = local_38.a;
  }
  *pr = (double)(~-(ulong)(local_38.a < 0.0) & (ulong)dVar1);
  dVar1 = 1.0;
  if (local_38.b <= 1.0) {
    dVar1 = local_38.b;
  }
  *pg = (double)(~-(ulong)(local_38.b < 0.0) & (ulong)dVar1);
  dVar1 = 1.0;
  if (local_38.c <= 1.0) {
    dVar1 = local_38.c;
  }
  *pb = (double)(~-(ulong)(local_38.c < 0.0) & (ulong)dVar1);
  return;
}

Assistant:

void
hsluv2rgb(double h, double s, double l, double* pr, double* pg, double* pb)
{
    Triplet tmp = { h, s, l };

    hsluv2lch(&tmp);
    lch2luv(&tmp);
    luv2xyz(&tmp);
    xyz2rgb(&tmp);

    *pr = CLAMP(tmp.a, 0.0, 1.0);
    *pg = CLAMP(tmp.b, 0.0, 1.0);
    *pb = CLAMP(tmp.c, 0.0, 1.0);
}